

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool __thiscall
cmFileCommand::HandleReadCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmCommandArgument *pcVar1;
  bool bVar2;
  int iVar3;
  _Ios_Seekdir _Var4;
  char *__s;
  long *plVar5;
  long sizeLimit;
  pointer ppcVar6;
  char c;
  string output;
  char hex [4];
  cmCommandArgumentGroup group;
  cmCommandArgumentsHelper argHelper;
  string fileName;
  string variable;
  cmCAString fileNameArg;
  cmCAString resultArg;
  cmCAString limitArg;
  cmCAString offsetArg;
  cmCAString readArg;
  cmCAEnabler hexOutputArg;
  ifstream file;
  bool local_5b1;
  cmCommand *local_5b0;
  string local_5a8;
  string local_588;
  cmCommandArgumentGroup local_568;
  undefined4 local_54c;
  cmCommandArgumentsHelper local_548;
  long *local_528;
  char *local_520;
  long local_518 [2];
  string local_508;
  undefined1 local_4e8 [16];
  _Rb_tree<const_cmCommandArgument_*,_const_cmCommandArgument_*,_std::_Identity<const_cmCommandArgument_*>,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
  local_4d8;
  bool local_49f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  undefined4 local_478;
  undefined1 local_470 [16];
  _Rb_tree<const_cmCommandArgument_*,_const_cmCommandArgument_*,_std::_Identity<const_cmCommandArgument_*>,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
  local_460;
  bool local_427;
  undefined1 *local_420;
  long local_418;
  undefined1 local_410;
  undefined7 uStack_40f;
  undefined4 local_400;
  cmCommandArgument local_3f8;
  char *local_3a8;
  long local_3a0;
  char local_398;
  undefined7 uStack_397;
  undefined4 local_388;
  cmCommandArgument local_380;
  char *local_330;
  long local_328;
  char local_320;
  undefined7 uStack_31f;
  undefined4 local_310;
  undefined1 local_308 [16];
  _Rb_tree<const_cmCommandArgument_*,_const_cmCommandArgument_*,_std::_Identity<const_cmCommandArgument_*>,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
  local_2f8;
  bool local_2bf;
  undefined1 *local_2b8;
  undefined8 local_2b0;
  undefined1 local_2a8;
  undefined7 uStack_2a7;
  undefined4 local_298;
  cmCommandArgument local_290;
  char local_240;
  undefined1 local_238 [32];
  byte abStack_218 [488];
  
  local_5b0 = &this->super_cmCommand;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 0x41) {
    local_238._0_8_ = local_238 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_238,"READ must be called with at least two additional arguments","");
    cmCommand::SetError(local_5b0,(string *)local_238);
    if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
      operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
    }
    return false;
  }
  local_548.Arguments.super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_548.Arguments.super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_548.Arguments.super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_568.ContainedArguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_568.ContainedArguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_568.ContainedArguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  cmCommandArgument::cmCommandArgument
            ((cmCommandArgument *)local_308,&local_548,"READ",(cmCommandArgumentGroup *)0x0);
  local_2b8 = &local_2a8;
  local_308._0_8_ = &PTR__cmCAString_005b0760;
  local_2b0 = 0;
  local_2a8 = 0;
  local_298 = 1;
  cmCommandArgument::cmCommandArgument
            ((cmCommandArgument *)local_4e8,&local_548,(char *)0x0,(cmCommandArgumentGroup *)0x0);
  local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
  local_4e8._0_8_ = &PTR__cmCAString_005b0760;
  local_498._M_string_length = 0;
  local_498.field_2._M_local_buf[0] = '\0';
  local_478 = 0;
  cmCommandArgument::cmCommandArgument
            ((cmCommandArgument *)local_470,&local_548,(char *)0x0,(cmCommandArgumentGroup *)0x0);
  local_420 = &local_410;
  local_470._0_8_ = &PTR__cmCAString_005b0760;
  local_418 = 0;
  local_410 = 0;
  local_400 = 0;
  cmCommandArgument::cmCommandArgument(&local_380,&local_548,"OFFSET",&local_568);
  local_330 = &local_320;
  local_380._vptr_cmCommandArgument = (_func_int **)&PTR__cmCAString_005b0760;
  local_328 = 0;
  local_320 = '\0';
  local_310 = 1;
  cmCommandArgument::cmCommandArgument(&local_3f8,&local_548,"LIMIT",&local_568);
  local_3a8 = &local_398;
  local_3f8._vptr_cmCommandArgument = (_func_int **)&PTR__cmCAString_005b0760;
  local_3a0 = 0;
  local_398 = '\0';
  local_388 = 1;
  cmCommandArgument::cmCommandArgument(&local_290,&local_548,"HEX",&local_568);
  local_290._vptr_cmCommandArgument = (_func_int **)&PTR__cmCommandArgument_005b0790;
  local_240 = '\0';
  local_238._0_8_ = (pointer)0x0;
  local_2bf = false;
  std::
  _Rb_tree<cmCommandArgument_const*,cmCommandArgument_const*,std::_Identity<cmCommandArgument_const*>,std::less<cmCommandArgument_const*>,std::allocator<cmCommandArgument_const*>>
  ::_M_insert_unique<cmCommandArgument_const*const&>
            ((_Rb_tree<cmCommandArgument_const*,cmCommandArgument_const*,std::_Identity<cmCommandArgument_const*>,std::less<cmCommandArgument_const*>,std::allocator<cmCommandArgument_const*>>
              *)&local_2f8,(cmCommandArgument **)local_238);
  local_49f = false;
  local_238._0_8_ = (cmCommandArgument *)local_308;
  std::
  _Rb_tree<cmCommandArgument_const*,cmCommandArgument_const*,std::_Identity<cmCommandArgument_const*>,std::less<cmCommandArgument_const*>,std::allocator<cmCommandArgument_const*>>
  ::_M_insert_unique<cmCommandArgument_const*const&>
            ((_Rb_tree<cmCommandArgument_const*,cmCommandArgument_const*,std::_Identity<cmCommandArgument_const*>,std::less<cmCommandArgument_const*>,std::allocator<cmCommandArgument_const*>>
              *)&local_4d8,(cmCommandArgument **)local_238);
  local_427 = false;
  local_238._0_8_ = (cmCommandArgument *)local_4e8;
  std::
  _Rb_tree<cmCommandArgument_const*,cmCommandArgument_const*,std::_Identity<cmCommandArgument_const*>,std::less<cmCommandArgument_const*>,std::allocator<cmCommandArgument_const*>>
  ::_M_insert_unique<cmCommandArgument_const*const&>
            ((_Rb_tree<cmCommandArgument_const*,cmCommandArgument_const*,std::_Identity<cmCommandArgument_const*>,std::less<cmCommandArgument_const*>,std::allocator<cmCommandArgument_const*>>
              *)&local_460,(cmCommandArgument **)local_238);
  if (local_568.ContainedArguments.
      super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_568.ContainedArguments.
      super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppcVar6 = local_568.ContainedArguments.
              super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      pcVar1 = *ppcVar6;
      pcVar1->ArgumentsBeforeEmpty = false;
      local_238._0_8_ = (cmCommandArgument *)local_470;
      std::
      _Rb_tree<cmCommandArgument_const*,cmCommandArgument_const*,std::_Identity<cmCommandArgument_const*>,std::less<cmCommandArgument_const*>,std::allocator<cmCommandArgument_const*>>
      ::_M_insert_unique<cmCommandArgument_const*const&>
                ((_Rb_tree<cmCommandArgument_const*,cmCommandArgument_const*,std::_Identity<cmCommandArgument_const*>,std::less<cmCommandArgument_const*>,std::allocator<cmCommandArgument_const*>>
                  *)&pcVar1->ArgumentsBefore,(cmCommandArgument **)local_238);
      ppcVar6 = ppcVar6 + 1;
    } while (ppcVar6 !=
             local_568.ContainedArguments.
             super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  cmCommandArgumentsHelper::Parse
            (&local_548,args,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x0);
  local_528 = local_518;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_528,local_498._M_dataplus._M_p,
             local_498._M_dataplus._M_p + local_498._M_string_length);
  bVar2 = cmsys::SystemTools::FileIsFullPath((char *)local_528);
  if (!bVar2) {
    __s = cmMakefile::GetCurrentSourceDirectory(local_5b0->Makefile);
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&local_528,0,local_520,(ulong)__s);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238,
                   "/",&local_498);
    std::__cxx11::string::_M_append((char *)&local_528,local_238._0_8_);
    if ((cmCommandArgument *)local_238._0_8_ != (cmCommandArgument *)(local_238 + 0x10)) {
      operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
    }
  }
  local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_508,local_420,local_420 + local_418);
  std::ifstream::ifstream(local_238,(char *)local_528,_S_in);
  bVar2 = (abStack_218[*(size_t *)(local_238._0_8_ + -0x18)] & 5) == 0;
  local_54c = (undefined4)CONCAT71((int7)(*(size_t *)(local_238._0_8_ + -0x18) >> 8),bVar2);
  if (bVar2) {
    if (local_3a0 == 0) {
      sizeLimit = -1;
    }
    else {
      iVar3 = atoi(local_3a8);
      sizeLimit = (long)iVar3;
    }
    if (local_328 == 0) {
      _Var4 = _S_beg;
    }
    else {
      _Var4 = atoi(local_330);
    }
    std::istream::seekg((long)local_238,_Var4);
    local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
    local_5a8._M_string_length = 0;
    local_5a8.field_2._M_local_buf[0] = '\0';
    if (local_240 == '\x01') {
      if (sizeLimit != 0) {
        do {
          plVar5 = (long *)std::istream::get(local_238);
          if ((*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) != 0) break;
          sprintf((char *)&local_588,"%.2x",(ulong)local_5b1);
          std::__cxx11::string::append((char *)&local_5a8);
          sizeLimit = sizeLimit - (ulong)(0 < sizeLimit);
        } while (sizeLimit != 0);
      }
    }
    else {
      local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
      local_588._M_string_length = 0;
      local_588.field_2._M_local_buf[0] = '\0';
      local_5b1 = false;
      if (sizeLimit != 0) {
        do {
          bVar2 = cmsys::SystemTools::GetLineFromStream
                            ((istream *)local_238,&local_588,&local_5b1,sizeLimit);
          if (!bVar2) break;
          if ((0 < sizeLimit) &&
             (sizeLimit = sizeLimit - (local_5b1 + local_588._M_string_length), sizeLimit < 1)) {
            sizeLimit = 0;
          }
          std::__cxx11::string::_M_append((char *)&local_5a8,(ulong)local_588._M_dataplus._M_p);
          if (local_5b1 == true) {
            std::__cxx11::string::append((char *)&local_5a8);
          }
        } while (sizeLimit != 0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_588._M_dataplus._M_p != &local_588.field_2) {
        operator_delete(local_588._M_dataplus._M_p,
                        CONCAT71(local_588.field_2._M_allocated_capacity._1_7_,
                                 local_588.field_2._M_local_buf[0]) + 1);
      }
    }
    cmMakefile::AddDefinition(local_5b0->Makefile,&local_508,local_5a8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a8._M_dataplus._M_p == &local_5a8.field_2) goto LAB_002771a1;
  }
  else {
    local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_5a8,"failed to open for reading (","");
    cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
    std::__cxx11::string::_M_append((char *)&local_5a8,(ulong)local_588._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_588._M_dataplus._M_p != &local_588.field_2) {
      operator_delete(local_588._M_dataplus._M_p,
                      CONCAT71(local_588.field_2._M_allocated_capacity._1_7_,
                               local_588.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::string::append((char *)&local_5a8);
    std::__cxx11::string::_M_append((char *)&local_5a8,(ulong)local_528);
    cmCommand::SetError(local_5b0,&local_5a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a8._M_dataplus._M_p == &local_5a8.field_2) goto LAB_002771a1;
  }
  operator_delete(local_5a8._M_dataplus._M_p,
                  CONCAT71(local_5a8.field_2._M_allocated_capacity._1_7_,
                           local_5a8.field_2._M_local_buf[0]) + 1);
LAB_002771a1:
  std::ifstream::~ifstream(local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_dataplus._M_p != &local_508.field_2) {
    operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
  }
  if (local_528 != local_518) {
    operator_delete(local_528,local_518[0] + 1);
  }
  local_290._vptr_cmCommandArgument = (_func_int **)&PTR__cmCommandArgument_005b06f8;
  std::
  _Rb_tree<const_cmCommandArgument_*,_const_cmCommandArgument_*,_std::_Identity<const_cmCommandArgument_*>,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
  ::~_Rb_tree(&local_290.ArgumentsBefore._M_t);
  local_3f8._vptr_cmCommandArgument = (_func_int **)&PTR__cmCAString_005b0760;
  if (local_3a8 != &local_398) {
    operator_delete(local_3a8,CONCAT71(uStack_397,local_398) + 1);
  }
  local_3f8._vptr_cmCommandArgument = (_func_int **)&PTR__cmCommandArgument_005b06f8;
  std::
  _Rb_tree<const_cmCommandArgument_*,_const_cmCommandArgument_*,_std::_Identity<const_cmCommandArgument_*>,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
  ::~_Rb_tree(&local_3f8.ArgumentsBefore._M_t);
  local_380._vptr_cmCommandArgument = (_func_int **)&PTR__cmCAString_005b0760;
  if (local_330 != &local_320) {
    operator_delete(local_330,CONCAT71(uStack_31f,local_320) + 1);
  }
  local_380._vptr_cmCommandArgument = (_func_int **)&PTR__cmCommandArgument_005b06f8;
  std::
  _Rb_tree<const_cmCommandArgument_*,_const_cmCommandArgument_*,_std::_Identity<const_cmCommandArgument_*>,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
  ::~_Rb_tree(&local_380.ArgumentsBefore._M_t);
  local_470._0_8_ = &PTR__cmCAString_005b0760;
  if (local_420 != &local_410) {
    operator_delete(local_420,CONCAT71(uStack_40f,local_410) + 1);
  }
  local_470._0_8_ = &PTR__cmCommandArgument_005b06f8;
  std::
  _Rb_tree<const_cmCommandArgument_*,_const_cmCommandArgument_*,_std::_Identity<const_cmCommandArgument_*>,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
  ::~_Rb_tree(&local_460);
  local_4e8._0_8_ = &PTR__cmCAString_005b0760;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != &local_498.field_2) {
    operator_delete(local_498._M_dataplus._M_p,
                    CONCAT71(local_498.field_2._M_allocated_capacity._1_7_,
                             local_498.field_2._M_local_buf[0]) + 1);
  }
  local_4e8._0_8_ = &PTR__cmCommandArgument_005b06f8;
  std::
  _Rb_tree<const_cmCommandArgument_*,_const_cmCommandArgument_*,_std::_Identity<const_cmCommandArgument_*>,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
  ::~_Rb_tree(&local_4d8);
  local_308._0_8_ = &PTR__cmCAString_005b0760;
  if (local_2b8 != &local_2a8) {
    operator_delete(local_2b8,CONCAT71(uStack_2a7,local_2a8) + 1);
  }
  local_308._0_8_ = &PTR__cmCommandArgument_005b06f8;
  std::
  _Rb_tree<const_cmCommandArgument_*,_const_cmCommandArgument_*,_std::_Identity<const_cmCommandArgument_*>,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
  ::~_Rb_tree(&local_2f8);
  if (local_568.ContainedArguments.
      super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_568.ContainedArguments.
                    super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_568.ContainedArguments.
                          super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_568.ContainedArguments.
                          super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_548.Arguments.
      super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_548.Arguments.
                    super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_548.Arguments.
                          super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_548.Arguments.
                          super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (bool)(undefined1)local_54c;
}

Assistant:

bool cmFileCommand::HandleReadCommand(std::vector<std::string> const& args)
{
  if ( args.size() < 3 )
    {
    this->SetError("READ must be called with at least two additional "
                   "arguments");
    return false;
    }

  cmCommandArgumentsHelper argHelper;
  cmCommandArgumentGroup group;

  cmCAString readArg    (&argHelper, "READ");
  cmCAString fileNameArg    (&argHelper, 0);
  cmCAString resultArg      (&argHelper, 0);

  cmCAString offsetArg      (&argHelper, "OFFSET", &group);
  cmCAString limitArg       (&argHelper, "LIMIT", &group);
  cmCAEnabler hexOutputArg  (&argHelper, "HEX", &group);
  readArg.Follows(0);
  fileNameArg.Follows(&readArg);
  resultArg.Follows(&fileNameArg);
  group.Follows(&resultArg);
  argHelper.Parse(&args, 0);

  std::string fileName = fileNameArg.GetString();
  if ( !cmsys::SystemTools::FileIsFullPath(fileName.c_str()) )
    {
    fileName = this->Makefile->GetCurrentSourceDirectory();
    fileName += "/" + fileNameArg.GetString();
    }

  std::string variable = resultArg.GetString();

  // Open the specified file.
#if defined(_WIN32) || defined(__CYGWIN__)
  cmsys::ifstream file(fileName.c_str(), std::ios::in |
               (hexOutputArg.IsEnabled() ? std::ios::binary : std::ios::in));
#else
  cmsys::ifstream file(fileName.c_str(), std::ios::in);
#endif

  if ( !file )
    {
    std::string error = "failed to open for reading (";
    error += cmSystemTools::GetLastSystemError();
    error += "):\n  ";
    error += fileName;
    this->SetError(error);
    return false;
    }

  // is there a limit?
  long sizeLimit = -1;
  if (!limitArg.GetString().empty())
    {
    sizeLimit = atoi(limitArg.GetCString());
    }

  // is there an offset?
  long offset = 0;
  if (!offsetArg.GetString().empty())
    {
    offset = atoi(offsetArg.GetCString());
    }

  file.seekg(offset, std::ios::beg); // explicit ios::beg for IBM VisualAge 6

  std::string output;

  if (hexOutputArg.IsEnabled())
    {
    // Convert part of the file into hex code
    char c;
    while((sizeLimit != 0) && (file.get(c)))
      {
      char hex[4];
      sprintf(hex, "%.2x", c&0xff);
      output += hex;
      if (sizeLimit > 0)
        {
        sizeLimit--;
        }
      }
    }
  else
    {
    std::string line;
    bool has_newline = false;
    while (sizeLimit != 0 &&
          cmSystemTools::GetLineFromStream(file, line, &has_newline,
                                            sizeLimit) )
      {
      if (sizeLimit > 0)
        {
        sizeLimit = sizeLimit - static_cast<long>(line.size());
        if (has_newline)
          {
          sizeLimit--;
          }
        if (sizeLimit < 0)
          {
          sizeLimit = 0;
          }
        }
      output += line;
      if ( has_newline )
        {
        output += "\n";
        }
      }
    }
  this->Makefile->AddDefinition(variable, output.c_str());
  return true;
}